

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
inf_or_nan_writer::operator()(inf_or_nan_writer *this,wchar_t **it)

{
  char cVar1;
  int *piVar2;
  type pwVar3;
  long *in_RSI;
  char *in_RDI;
  
  if (*in_RDI != '\0') {
    cVar1 = *in_RDI;
    piVar2 = (int *)*in_RSI;
    *in_RSI = (long)(piVar2 + 1);
    *piVar2 = (int)cVar1;
  }
  pwVar3 = internal::copy_str<wchar_t,char_const*,wchar_t*>
                     ((char *)in_RSI,in_RDI,(wchar_t *)0x174ea4);
  *in_RSI = (long)pwVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }